

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

void __thiscall
SmallDenseMap<unsigned_int,_bool,_SmallDenseMapUnsignedHasher,_128U>::insert
          (SmallDenseMap<unsigned_int,_bool,_SmallDenseMapUnsignedHasher,_128U> *this,uint *key,
          bool *value)

{
  Node *pNVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  char *__assertion;
  int iVar5;
  
  uVar2 = *key;
  if (uVar2 == 0) {
    __assertion = "key != Key()";
    uVar2 = 0x3b;
  }
  else {
    uVar3 = this->bucketCount;
    if (uVar3 <= (this->count >> 2) + this->count) {
      rehash(this);
      uVar3 = this->bucketCount;
      uVar2 = *key;
    }
    uVar4 = uVar2 * -0x61c88647;
    pNVar1 = this->data;
    for (iVar5 = 1; iVar5 - uVar3 != 1; iVar5 = iVar5 + 1) {
      uVar4 = uVar4 & uVar3 - 1;
      if (pNVar1[uVar4].key == 0) {
        pNVar1[uVar4].key = uVar2;
        pNVar1[uVar4].value = *value;
        this->count = this->count + 1;
        return;
      }
      if (pNVar1[uVar4].key == uVar2) {
        pNVar1[uVar4].value = *value;
        return;
      }
      uVar4 = uVar4 + iVar5;
    }
    __assertion = "!\"couldn\'t insert node\"";
    uVar2 = 0x5b;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                ,uVar2,
                "void SmallDenseMap<unsigned int, bool, SmallDenseMapUnsignedHasher, 128>::insert(const Key &, const Value &) [Key = unsigned int, Value = bool, Hasher = SmallDenseMapUnsignedHasher, N = 128]"
               );
}

Assistant:

void insert(const Key& key, const Value& value)
	{
		// Default value is used as an empty marker
		assert(key != Key());

		// Keep occupancy at <80%
		if(count + (count >> 2) >= bucketCount)
			rehash();

		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
			{
				item.key = key;
				item.value = value;

				count++;
				return;
			}

			if(item.key == key)
			{
				item.value = value;
				return;
			}

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		assert(!"couldn't insert node");
	}